

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  double dVar1;
  bool bVar2;
  unsigned_short uVar3;
  short sVar4;
  uint16_t uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  int32_t iVar9;
  unsigned_long uVar10;
  long lVar11;
  uint64_t uVar12;
  size_t size;
  char *in_R8;
  float fVar13;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_60;
  big_endian<unsigned_int,_unsigned_int> local_40;
  little_endian<unsigned_int,_unsigned_int> local_3c;
  reverse_endian<unsigned_int,_unsigned_int> local_38;
  converted_endian local_34 [4];
  anon_union_4_3_26d3076b data;
  re_double x_2;
  re_uint64_t x_1;
  uint32_t y;
  char **ppcStack_18;
  re_uint32_t x;
  char **param_1_local;
  int param_0_local;
  
  ppcStack_18 = param_2;
  uVar3 = phosg::sign_extend<unsigned_short,unsigned_char>('\0');
  phosg::expect_generic
            (uVar3 == 0,"0x0000 != (sign_extend<uint16_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,10);
  uVar3 = phosg::sign_extend<unsigned_short,unsigned_char>('\x01');
  phosg::expect_generic
            (uVar3 == 1,"0x0001 != (sign_extend<uint16_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xb);
  uVar3 = phosg::sign_extend<unsigned_short,unsigned_char>('\x7f');
  phosg::expect_generic
            (uVar3 == 0x7f,"0x007F != (sign_extend<uint16_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xc);
  uVar3 = phosg::sign_extend<unsigned_short,unsigned_char>(0x80);
  phosg::expect_generic
            (uVar3 == 0xff80,"0xFF80 != (sign_extend<uint16_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xd);
  uVar3 = phosg::sign_extend<unsigned_short,unsigned_char>(0xff);
  phosg::expect_generic
            (uVar3 == 0xffff,"0xFFFF != (sign_extend<uint16_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xe);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_char>('\0');
  phosg::expect_generic
            (uVar6 == 0,"0x00000000 != (sign_extend<uint32_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xf);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_char>('\x01');
  phosg::expect_generic
            (uVar6 == 1,"0x00000001 != (sign_extend<uint32_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x10);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_char>('\x7f');
  phosg::expect_generic
            (uVar6 == 0x7f,"0x0000007F != (sign_extend<uint32_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x11);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_char>(0x80);
  phosg::expect_generic
            (uVar6 == 0xffffff80,"0xFFFFFF80 != (sign_extend<uint32_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x12);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_char>(0xff);
  phosg::expect_generic
            (uVar6 == 0xffffffff,"0xFFFFFFFF != (sign_extend<uint32_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x13);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_char>('\0');
  phosg::expect_generic
            (uVar10 == 0,"0x0000000000000000 != (sign_extend<uint64_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x14);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_char>('\x01');
  phosg::expect_generic
            (uVar10 == 1,"0x0000000000000001 != (sign_extend<uint64_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x15);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_char>('\x7f');
  phosg::expect_generic
            (uVar10 == 0x7f,"0x000000000000007F != (sign_extend<uint64_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x16);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_char>(0x80);
  phosg::expect_generic
            (uVar10 == 0xffffffffffffff80,
             "0xFFFFFFFFFFFFFF80 != (sign_extend<uint64_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x17);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_char>(0xff);
  phosg::expect_generic
            (uVar10 == 0xffffffffffffffff,
             "0xFFFFFFFFFFFFFFFF != (sign_extend<uint64_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x18);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_short>(0);
  phosg::expect_generic
            (uVar6 == 0,"0x00000000 != (sign_extend<uint32_t, uint16_t>(0x0000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x19);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_short>(1);
  phosg::expect_generic
            (uVar6 == 1,"0x00000001 != (sign_extend<uint32_t, uint16_t>(0x0001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1a);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_short>(0x7fff);
  phosg::expect_generic
            (uVar6 == 0x7fff,"0x00007FFF != (sign_extend<uint32_t, uint16_t>(0x7FFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1b);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_short>(0x8000);
  phosg::expect_generic
            (uVar6 == 0xffff8000,"0xFFFF8000 != (sign_extend<uint32_t, uint16_t>(0x8000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1c);
  uVar6 = phosg::sign_extend<unsigned_int,unsigned_short>(0xffff);
  phosg::expect_generic
            (uVar6 == 0xffffffff,"0xFFFFFFFF != (sign_extend<uint32_t, uint16_t>(0xFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1d);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_short>(0);
  phosg::expect_generic
            (uVar10 == 0,"0x0000000000000000 != (sign_extend<uint64_t, uint16_t>(0x0000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1e);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_short>(1);
  phosg::expect_generic
            (uVar10 == 1,"0x0000000000000001 != (sign_extend<uint64_t, uint16_t>(0x0001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1f);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_short>(0x7fff);
  phosg::expect_generic
            (uVar10 == 0x7fff,"0x0000000000007FFF != (sign_extend<uint64_t, uint16_t>(0x7FFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x20);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_short>(0x8000);
  phosg::expect_generic
            (uVar10 == 0xffffffffffff8000,
             "0xFFFFFFFFFFFF8000 != (sign_extend<uint64_t, uint16_t>(0x8000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x21);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_short>(0xffff);
  phosg::expect_generic
            (uVar10 == 0xffffffffffffffff,
             "0xFFFFFFFFFFFFFFFF != (sign_extend<uint64_t, uint16_t>(0xFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x22);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_int>(0);
  phosg::expect_generic
            (uVar10 == 0,"0x0000000000000000 != (sign_extend<uint64_t, uint32_t>(0x00000000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x23);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_int>(1);
  phosg::expect_generic
            (uVar10 == 1,"0x0000000000000001 != (sign_extend<uint64_t, uint32_t>(0x00000001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x24);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_int>(0x7fffffff);
  phosg::expect_generic
            (uVar10 == 0x7fffffff,
             "0x000000007FFFFFFF != (sign_extend<uint64_t, uint32_t>(0x7FFFFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x25);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_int>(0x80000000);
  phosg::expect_generic
            (uVar10 == 0xffffffff80000000,
             "0xFFFFFFFF80000000 != (sign_extend<uint64_t, uint32_t>(0x80000000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x26);
  uVar10 = phosg::sign_extend<unsigned_long,unsigned_int>(0xffffffff);
  phosg::expect_generic
            (uVar10 == 0xffffffffffffffff,
             "0xFFFFFFFFFFFFFFFF != (sign_extend<uint64_t, uint32_t>(0xFFFFFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x27);
  sVar4 = phosg::sign_extend<short,unsigned_char>('\0');
  phosg::expect_generic
            (sVar4 == 0,"0 != (sign_extend<int16_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x29);
  sVar4 = phosg::sign_extend<short,unsigned_char>('\x01');
  phosg::expect_generic
            (sVar4 == 1,"1 != (sign_extend<int16_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2a);
  sVar4 = phosg::sign_extend<short,unsigned_char>('\x7f');
  phosg::expect_generic
            (sVar4 == 0x7f,"127 != (sign_extend<int16_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2b);
  sVar4 = phosg::sign_extend<short,unsigned_char>(0x80);
  phosg::expect_generic
            (sVar4 == -0x80,"-128 != (sign_extend<int16_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2c);
  sVar4 = phosg::sign_extend<short,unsigned_char>(0xff);
  phosg::expect_generic
            (sVar4 == -1,"-1 != (sign_extend<int16_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2d);
  iVar7 = phosg::sign_extend<int,unsigned_char>('\0');
  phosg::expect_generic
            (iVar7 == 0,"0 != (sign_extend<int32_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2e);
  iVar7 = phosg::sign_extend<int,unsigned_char>('\x01');
  phosg::expect_generic
            (iVar7 == 1,"1 != (sign_extend<int32_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2f);
  iVar7 = phosg::sign_extend<int,unsigned_char>('\x7f');
  phosg::expect_generic
            (iVar7 == 0x7f,"127 != (sign_extend<int32_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x30);
  iVar7 = phosg::sign_extend<int,unsigned_char>(0x80);
  phosg::expect_generic
            (iVar7 == -0x80,"-128 != (sign_extend<int32_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x31);
  iVar7 = phosg::sign_extend<int,unsigned_char>(0xff);
  phosg::expect_generic
            (iVar7 == -1,"-1 != (sign_extend<int32_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x32);
  lVar11 = phosg::sign_extend<long,unsigned_char>('\0');
  phosg::expect_generic
            (lVar11 == 0,"0 != (sign_extend<int64_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x33);
  lVar11 = phosg::sign_extend<long,unsigned_char>('\x01');
  phosg::expect_generic
            (lVar11 == 1,"1 != (sign_extend<int64_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x34);
  lVar11 = phosg::sign_extend<long,unsigned_char>('\x7f');
  phosg::expect_generic
            (lVar11 == 0x7f,"127 != (sign_extend<int64_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x35);
  lVar11 = phosg::sign_extend<long,unsigned_char>(0x80);
  phosg::expect_generic
            (lVar11 == -0x80,"-128 != (sign_extend<int64_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x36);
  lVar11 = phosg::sign_extend<long,unsigned_char>(0xff);
  phosg::expect_generic
            (lVar11 == -1,"-1 != (sign_extend<int64_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x37);
  iVar7 = phosg::sign_extend<int,unsigned_short>(0);
  phosg::expect_generic
            (iVar7 == 0,"0 != (sign_extend<int32_t, uint16_t>(0x0000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x38);
  iVar7 = phosg::sign_extend<int,unsigned_short>(1);
  phosg::expect_generic
            (iVar7 == 1,"1 != (sign_extend<int32_t, uint16_t>(0x0001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x39);
  iVar7 = phosg::sign_extend<int,unsigned_short>(0x7fff);
  phosg::expect_generic
            (iVar7 == 0x7fff,"32767 != (sign_extend<int32_t, uint16_t>(0x7FFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3a);
  iVar7 = phosg::sign_extend<int,unsigned_short>(0x8000);
  phosg::expect_generic
            (iVar7 == -0x8000,"-32768 != (sign_extend<int32_t, uint16_t>(0x8000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3b);
  iVar7 = phosg::sign_extend<int,unsigned_short>(0xffff);
  phosg::expect_generic
            (iVar7 == -1,"-1 != (sign_extend<int32_t, uint16_t>(0xFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3c);
  lVar11 = phosg::sign_extend<long,unsigned_short>(0);
  phosg::expect_generic
            (lVar11 == 0,"0 != (sign_extend<int64_t, uint16_t>(0x0000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3d);
  lVar11 = phosg::sign_extend<long,unsigned_short>(1);
  phosg::expect_generic
            (lVar11 == 1,"1 != (sign_extend<int64_t, uint16_t>(0x0001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3e);
  lVar11 = phosg::sign_extend<long,unsigned_short>(0x7fff);
  phosg::expect_generic
            (lVar11 == 0x7fff,"32767 != (sign_extend<int64_t, uint16_t>(0x7FFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3f);
  lVar11 = phosg::sign_extend<long,unsigned_short>(0x8000);
  phosg::expect_generic
            (lVar11 == -0x8000,"-32768 != (sign_extend<int64_t, uint16_t>(0x8000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x40);
  lVar11 = phosg::sign_extend<long,unsigned_short>(0xffff);
  phosg::expect_generic
            (lVar11 == -1,"-1 != (sign_extend<int64_t, uint16_t>(0xFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x41);
  lVar11 = phosg::sign_extend<long,unsigned_int>(0);
  phosg::expect_generic
            (lVar11 == 0,"0 != (sign_extend<int64_t, uint32_t>(0x00000000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x42);
  lVar11 = phosg::sign_extend<long,unsigned_int>(1);
  phosg::expect_generic
            (lVar11 == 1,"1 != (sign_extend<int64_t, uint32_t>(0x00000001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x43);
  lVar11 = phosg::sign_extend<long,unsigned_int>(0x7fffffff);
  phosg::expect_generic
            (lVar11 == 0x7fffffff,"2147483647 != (sign_extend<int64_t, uint32_t>(0x7FFFFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x44);
  lVar11 = phosg::sign_extend<long,unsigned_int>(0x80000000);
  phosg::expect_generic
            (lVar11 == -0x80000000,"-2147483648 != (sign_extend<int64_t, uint32_t>(0x80000000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x45);
  lVar11 = phosg::sign_extend<long,unsigned_int>(0xffffffff);
  phosg::expect_generic
            (lVar11 == -1,"-1 != (sign_extend<int64_t, uint32_t>(0xFFFFFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x46);
  uVar5 = phosg::bswap16(0x123);
  phosg::expect_generic
            (uVar5 == 0x2301,"0x2301 != bswap16(0x0123)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x48);
  uVar8 = phosg::bswap24(0x12345);
  phosg::expect_generic
            (uVar8 == 0x452301,"0x452301 != bswap24(0x012345)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x49);
  uVar8 = phosg::bswap24(0x1234567);
  phosg::expect_generic
            (uVar8 == 0x674523,"0x674523 != bswap24(0x01234567)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4a);
  uVar8 = phosg::bswap32(0x1234567);
  phosg::expect_generic
            (uVar8 == 0x67452301,"0x67452301 != bswap32(0x01234567)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4b);
  uVar12 = phosg::bswap64(0x123456789abcdef);
  phosg::expect_generic
            (uVar12 == 0xefcdab8967452301,"0xEFCDAB8967452301 != bswap64(0x0123456789ABCDEF)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4c);
  uVar5 = phosg::bswap16(0xffff);
  phosg::expect_generic
            (uVar5 == 0xffff,"(uint16_t)-1 != bswap16(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4e);
  uVar8 = phosg::bswap24(0xffffffff);
  phosg::expect_generic
            (uVar8 == 0xffffff,"(uint32_t)0x00FFFFFF != bswap24(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4f);
  iVar9 = phosg::bswap24s(-1);
  phosg::expect_generic
            (iVar9 == -1,"(int32_t)-1 != bswap24s(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x50);
  uVar8 = phosg::bswap32(0xffffffff);
  phosg::expect_generic
            (uVar8 == 0xffffffff,"(uint32_t)-1 != bswap32(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x51);
  uVar12 = phosg::bswap64(0xffffffffffffffff);
  phosg::expect_generic
            (uVar12 == 0xffffffffffffffff,"(uint64_t)-1 != bswap64(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x52);
  uVar5 = phosg::bswap16(0xfffe);
  phosg::expect_generic
            (uVar5 == 0xfeff,"(uint16_t)-257 != bswap16(-2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x54);
  iVar9 = phosg::bswap24s(-2);
  phosg::expect_generic
            (iVar9 == -0x10001,"(int32_t)-65537 != bswap24s(-2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x55);
  uVar8 = phosg::bswap32(0xfffffffe);
  phosg::expect_generic
            (uVar8 == 0xfeffffff,"(uint32_t)-16777217 != bswap32(-2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x56);
  uVar12 = phosg::bswap64(0xfffffffffffffffe);
  phosg::expect_generic
            (uVar12 == 0xfeffffffffffffff,"(uint64_t)-72057594037927937 != bswap64(-2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x57);
  fVar13 = phosg::bswap32f(0x66662640);
  phosg::expect_generic
            ((bool)(-(fVar13 == 2.6) & 1),"2.6f != bswap32f((uint32_t)0x66662640)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x59);
  uVar8 = phosg::bswap32f(2.6);
  phosg::expect_generic
            (uVar8 == 0x66662640,"0x66662640UL != bswap32f(2.6f)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x5a);
  dVar1 = phosg::bswap64f(0xcdcccccccccc0840);
  phosg::expect_generic
            ((bool)(-(dVar1 == 3.1) & 1),"3.1 != bswap64f((uint64_t)0xCDCCCCCCCCCC0840)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x5b);
  uVar12 = phosg::bswap64f(3.1);
  phosg::expect_generic
            (uVar12 == 0xcdcccccccccc0840,"0xCDCCCCCCCCCC0840 != bswap64f(3.1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x5c);
  phosg::reverse_endian<unsigned_int,_unsigned_int>::converted_endian
            ((reverse_endian<unsigned_int,_unsigned_int> *)
             ((long)&x_1.
                     super_converted_endian<unsigned_long,_unsigned_long,_phosg::bswap_st<unsigned_long,_unsigned_long>,_phosg::bswap_st<unsigned_long,_unsigned_long>_>
                     .value + 4),3);
  y = x_1.
      super_converted_endian<unsigned_long,_unsigned_long,_phosg::bswap_st<unsigned_long,_unsigned_long>,_phosg::bswap_st<unsigned_long,_unsigned_long>_>
      .value._4_4_;
  uVar6 = phosg::converted_endian::operator_cast_to_unsigned_int((converted_endian *)&y);
  phosg::expect_generic
            (uVar6 == 3,"3 != x",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x61);
  uVar6 = phosg::
          converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
          ::load_raw((converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                      *)&y);
  phosg::expect_generic
            (uVar6 == 0x3000000,"0x03000000 != x.load_raw()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x62);
  x_1.
  super_converted_endian<unsigned_long,_unsigned_long,_phosg::bswap_st<unsigned_long,_unsigned_long>,_phosg::bswap_st<unsigned_long,_unsigned_long>_>
  .value._0_4_ = phosg::converted_endian::operator_cast_to_unsigned_int((converted_endian *)&y);
  phosg::expect_generic
            ((uint)x_1.
                   super_converted_endian<unsigned_long,_unsigned_long,_phosg::bswap_st<unsigned_long,_unsigned_long>,_phosg::bswap_st<unsigned_long,_unsigned_long>_>
                   .value == 3,"3 != y",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,100);
  phosg::reverse_endian<unsigned_long,_unsigned_long>::converted_endian
            ((reverse_endian<unsigned_long,_unsigned_long> *)&x_2,0x102030405060708);
  uVar10 = phosg::converted_endian::operator_cast_to_unsigned_long((converted_endian *)&x_2);
  phosg::expect_generic
            (uVar10 == 0x102030405060708,"0x0102030405060708 != x",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x68);
  uVar10 = phosg::
           converted_endian<unsigned_long,_unsigned_long,_phosg::bswap_st<unsigned_long,_unsigned_long>,_phosg::bswap_st<unsigned_long,_unsigned_long>_>
           ::load_raw((converted_endian<unsigned_long,_unsigned_long,_phosg::bswap_st<unsigned_long,_unsigned_long>,_phosg::bswap_st<unsigned_long,_unsigned_long>_>
                       *)&x_2);
  phosg::expect_generic
            (uVar10 == 0x807060504030201,"0x0807060504030201 != x.load_raw()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x69);
  phosg::reverse_endian<double,_unsigned_long>::converted_endian
            ((reverse_endian<double,_unsigned_long> *)local_34,1.0);
  dVar1 = phosg::converted_endian::operator_cast_to_double(local_34);
  phosg::expect_generic
            ((bool)(-(dVar1 == 1.0) & 1),"1.0 != x",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x6d);
  uVar10 = phosg::
           converted_endian<double,_unsigned_long,_phosg::bswap_st<double,_unsigned_long>,_phosg::bswap_st<unsigned_long,_double>_>
           ::load_raw((converted_endian<double,_unsigned_long,_phosg::bswap_st<double,_unsigned_long>,_phosg::bswap_st<unsigned_long,_double>_>
                       *)local_34);
  phosg::expect_generic
            (uVar10 == 0xf03f,"0x000000000000F03F != x.load_raw()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x6e);
  phosg::little_endian<unsigned_int,_unsigned_int>::converted_endian(&local_3c,0x1020304);
  local_38.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
  .value = (converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
            )(converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
              )local_3c.super_same_endian<unsigned_int,_unsigned_int>.
               super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
               .value;
  uVar6 = phosg::converted_endian::operator_cast_to_unsigned_int((converted_endian *)&local_38);
  phosg::expect_generic
            (uVar6 == 0x4030201,"data.be32 != 0x04030201",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x79);
  phosg::expect_generic
            (local_38.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
             .value._0_1_ == (converted_endian)0x4,"data.bytes[0] != 0x04",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x7a);
  phosg::big_endian<unsigned_int,_unsigned_int>::converted_endian(&local_40,0x1020304);
  local_38.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
  .value = (converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
            )(converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
              )local_40.super_reverse_endian<unsigned_int,_unsigned_int>.
               super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
               .value;
  uVar6 = phosg::converted_endian::operator_cast_to_unsigned_int((converted_endian *)&local_38);
  phosg::expect_generic
            (uVar6 == 0x4030201,"data.le32 != 0x04030201",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x7c);
  phosg::expect_generic
            (local_38.
             super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
             .value._0_1_ == (converted_endian)0x1,"data.bytes[0] != 0x01",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x7d);
  phosg::base64_encode_abi_cxx11_(&local_60,(phosg *)0x137335,(void *)0x0,0,in_R8);
  bVar2 = std::operator==(&local_60,"");
  phosg::expect_generic
            (bVar2,"\"\" != base64_encode(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x81);
  std::__cxx11::string::~string((string *)&local_60);
  phosg::base64_encode_abi_cxx11_(&local_90,(phosg *)0x136fe2,(void *)0x1,0,in_R8);
  bVar2 = std::operator==(&local_90,"MQ==");
  phosg::expect_generic
            (bVar2,"\"MQ==\" != base64_encode(\"1\", 1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x82);
  std::__cxx11::string::~string((string *)&local_90);
  phosg::base64_encode_abi_cxx11_(&local_b0,(phosg *)0x13708f,(void *)0x2,0,in_R8);
  bVar2 = std::operator==(&local_b0,"MTE=");
  phosg::expect_generic
            (bVar2,"\"MTE=\" != base64_encode(\"11\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x83);
  std::__cxx11::string::~string((string *)&local_b0);
  phosg::base64_encode_abi_cxx11_(&local_d0,(phosg *)"111",(void *)0x3,0,in_R8);
  bVar2 = std::operator==(&local_d0,"MTEx");
  phosg::expect_generic
            (bVar2,"\"MTEx\" != base64_encode(\"111\", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x84);
  std::__cxx11::string::~string((string *)&local_d0);
  phosg::base64_encode_abi_cxx11_(&local_f0,(phosg *)"1112",(void *)0x4,0,in_R8);
  bVar2 = std::operator==(&local_f0,"MTExMg==");
  phosg::expect_generic
            (bVar2,"\"MTExMg==\" != base64_encode(\"1112\", 4)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x85);
  std::__cxx11::string::~string((string *)&local_f0);
  phosg::base64_encode_abi_cxx11_(&local_110,(phosg *)"11122",(void *)0x5,0,in_R8);
  bVar2 = std::operator==(&local_110,"MTExMjI=");
  phosg::expect_generic
            (bVar2,"\"MTExMjI=\" != base64_encode(\"11122\", 5)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x86);
  std::__cxx11::string::~string((string *)&local_110);
  phosg::base64_encode_abi_cxx11_(&local_130,(phosg *)"111222",(void *)0x6,0,in_R8);
  bVar2 = std::operator==(&local_130,"MTExMjIy");
  phosg::expect_generic
            (bVar2,"\"MTExMjIy\" != base64_encode(\"111222\", 6)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x87);
  std::__cxx11::string::~string((string *)&local_130);
  phosg::base64_decode_abi_cxx11_(&local_150,(phosg *)0x137335,(void *)0x0,0,in_R8);
  bVar2 = std::operator==(&local_150,"");
  phosg::expect_generic
            (bVar2,"\"\" != base64_decode(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x89);
  std::__cxx11::string::~string((string *)&local_150);
  phosg::base64_decode_abi_cxx11_(&local_170,(phosg *)"MQ==",(void *)0x4,0,in_R8);
  bVar2 = std::operator==(&local_170,"1");
  phosg::expect_generic
            (bVar2,"\"1\" != base64_decode(\"MQ==\", 4)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8a);
  std::__cxx11::string::~string((string *)&local_170);
  phosg::base64_decode_abi_cxx11_(&local_190,(phosg *)"MTE=",(void *)0x4,0,in_R8);
  bVar2 = std::operator==(&local_190,"11");
  phosg::expect_generic
            (bVar2,"\"11\" != base64_decode(\"MTE=\", 4)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8b);
  std::__cxx11::string::~string((string *)&local_190);
  phosg::base64_decode_abi_cxx11_(&local_1b0,(phosg *)"MTEx",(void *)0x4,0,in_R8);
  bVar2 = std::operator==(&local_1b0,"111");
  phosg::expect_generic
            (bVar2,"\"111\" != base64_decode(\"MTEx\", 4)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8c);
  std::__cxx11::string::~string((string *)&local_1b0);
  phosg::base64_decode_abi_cxx11_(&local_1d0,(phosg *)"MTExMg==",(void *)0x8,0,in_R8);
  bVar2 = std::operator==(&local_1d0,"1112");
  phosg::expect_generic
            (bVar2,"\"1112\" != base64_decode(\"MTExMg==\", 8)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8d);
  std::__cxx11::string::~string((string *)&local_1d0);
  phosg::base64_decode_abi_cxx11_(&local_1f0,(phosg *)"MTExMjI=",(void *)0x8,0,in_R8);
  bVar2 = std::operator==(&local_1f0,"11122");
  phosg::expect_generic
            (bVar2,"\"11122\" != base64_decode(\"MTExMjI=\", 8)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8e);
  std::__cxx11::string::~string((string *)&local_1f0);
  phosg::base64_decode_abi_cxx11_(&local_210,(phosg *)"MTExMjIy",(void *)0x8,0,in_R8);
  bVar2 = std::operator==(&local_210,"111222");
  size = 0x8f;
  phosg::expect_generic
            (bVar2,"\"111222\" != base64_decode(\"MTExMjIy\", 8)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8f);
  std::__cxx11::string::~string((string *)&local_210);
  phosg::rot13_abi_cxx11_
            (&local_230,(phosg *)"Gur oevpx dhbja wbk shzcf bire gur qnml ybt",(void *)0x2b,size);
  bVar2 = std::operator==(&local_230,"The brick quown jox fumps over the dazy log");
  phosg::expect_generic
            (bVar2,
             "\"The brick quown jox fumps over the dazy log\" != rot13(\"Gur oevpx dhbja wbk shzcf bire gur qnml ybt\", 43)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x91);
  std::__cxx11::string::~string((string *)&local_230);
  printf("EncodingTest: all tests passed\n");
  return 0;
}

Assistant:

int main(int, char**) {
  expect_eq(0x0000, (sign_extend<uint16_t, uint8_t>(0x00)));
  expect_eq(0x0001, (sign_extend<uint16_t, uint8_t>(0x01)));
  expect_eq(0x007F, (sign_extend<uint16_t, uint8_t>(0x7F)));
  expect_eq(0xFF80, (sign_extend<uint16_t, uint8_t>(0x80)));
  expect_eq(0xFFFF, (sign_extend<uint16_t, uint8_t>(0xFF)));
  expect_eq(0x00000000, (sign_extend<uint32_t, uint8_t>(0x00)));
  expect_eq(0x00000001, (sign_extend<uint32_t, uint8_t>(0x01)));
  expect_eq(0x0000007F, (sign_extend<uint32_t, uint8_t>(0x7F)));
  expect_eq(0xFFFFFF80, (sign_extend<uint32_t, uint8_t>(0x80)));
  expect_eq(0xFFFFFFFF, (sign_extend<uint32_t, uint8_t>(0xFF)));
  expect_eq(0x0000000000000000, (sign_extend<uint64_t, uint8_t>(0x00)));
  expect_eq(0x0000000000000001, (sign_extend<uint64_t, uint8_t>(0x01)));
  expect_eq(0x000000000000007F, (sign_extend<uint64_t, uint8_t>(0x7F)));
  expect_eq(0xFFFFFFFFFFFFFF80, (sign_extend<uint64_t, uint8_t>(0x80)));
  expect_eq(0xFFFFFFFFFFFFFFFF, (sign_extend<uint64_t, uint8_t>(0xFF)));
  expect_eq(0x00000000, (sign_extend<uint32_t, uint16_t>(0x0000)));
  expect_eq(0x00000001, (sign_extend<uint32_t, uint16_t>(0x0001)));
  expect_eq(0x00007FFF, (sign_extend<uint32_t, uint16_t>(0x7FFF)));
  expect_eq(0xFFFF8000, (sign_extend<uint32_t, uint16_t>(0x8000)));
  expect_eq(0xFFFFFFFF, (sign_extend<uint32_t, uint16_t>(0xFFFF)));
  expect_eq(0x0000000000000000, (sign_extend<uint64_t, uint16_t>(0x0000)));
  expect_eq(0x0000000000000001, (sign_extend<uint64_t, uint16_t>(0x0001)));
  expect_eq(0x0000000000007FFF, (sign_extend<uint64_t, uint16_t>(0x7FFF)));
  expect_eq(0xFFFFFFFFFFFF8000, (sign_extend<uint64_t, uint16_t>(0x8000)));
  expect_eq(0xFFFFFFFFFFFFFFFF, (sign_extend<uint64_t, uint16_t>(0xFFFF)));
  expect_eq(0x0000000000000000, (sign_extend<uint64_t, uint32_t>(0x00000000)));
  expect_eq(0x0000000000000001, (sign_extend<uint64_t, uint32_t>(0x00000001)));
  expect_eq(0x000000007FFFFFFF, (sign_extend<uint64_t, uint32_t>(0x7FFFFFFF)));
  expect_eq(0xFFFFFFFF80000000, (sign_extend<uint64_t, uint32_t>(0x80000000)));
  expect_eq(0xFFFFFFFFFFFFFFFF, (sign_extend<uint64_t, uint32_t>(0xFFFFFFFF)));

  expect_eq(0, (sign_extend<int16_t, uint8_t>(0x00)));
  expect_eq(1, (sign_extend<int16_t, uint8_t>(0x01)));
  expect_eq(127, (sign_extend<int16_t, uint8_t>(0x7F)));
  expect_eq(-128, (sign_extend<int16_t, uint8_t>(0x80)));
  expect_eq(-1, (sign_extend<int16_t, uint8_t>(0xFF)));
  expect_eq(0, (sign_extend<int32_t, uint8_t>(0x00)));
  expect_eq(1, (sign_extend<int32_t, uint8_t>(0x01)));
  expect_eq(127, (sign_extend<int32_t, uint8_t>(0x7F)));
  expect_eq(-128, (sign_extend<int32_t, uint8_t>(0x80)));
  expect_eq(-1, (sign_extend<int32_t, uint8_t>(0xFF)));
  expect_eq(0, (sign_extend<int64_t, uint8_t>(0x00)));
  expect_eq(1, (sign_extend<int64_t, uint8_t>(0x01)));
  expect_eq(127, (sign_extend<int64_t, uint8_t>(0x7F)));
  expect_eq(-128, (sign_extend<int64_t, uint8_t>(0x80)));
  expect_eq(-1, (sign_extend<int64_t, uint8_t>(0xFF)));
  expect_eq(0, (sign_extend<int32_t, uint16_t>(0x0000)));
  expect_eq(1, (sign_extend<int32_t, uint16_t>(0x0001)));
  expect_eq(32767, (sign_extend<int32_t, uint16_t>(0x7FFF)));
  expect_eq(-32768, (sign_extend<int32_t, uint16_t>(0x8000)));
  expect_eq(-1, (sign_extend<int32_t, uint16_t>(0xFFFF)));
  expect_eq(0, (sign_extend<int64_t, uint16_t>(0x0000)));
  expect_eq(1, (sign_extend<int64_t, uint16_t>(0x0001)));
  expect_eq(32767, (sign_extend<int64_t, uint16_t>(0x7FFF)));
  expect_eq(-32768, (sign_extend<int64_t, uint16_t>(0x8000)));
  expect_eq(-1, (sign_extend<int64_t, uint16_t>(0xFFFF)));
  expect_eq(0, (sign_extend<int64_t, uint32_t>(0x00000000)));
  expect_eq(1, (sign_extend<int64_t, uint32_t>(0x00000001)));
  expect_eq(2147483647, (sign_extend<int64_t, uint32_t>(0x7FFFFFFF)));
  expect_eq(-2147483648, (sign_extend<int64_t, uint32_t>(0x80000000)));
  expect_eq(-1, (sign_extend<int64_t, uint32_t>(0xFFFFFFFF)));

  expect_eq(0x2301, bswap16(0x0123));
  expect_eq(0x452301, bswap24(0x012345));
  expect_eq(0x674523, bswap24(0x01234567));
  expect_eq(0x67452301, bswap32(0x01234567));
  expect_eq(0xEFCDAB8967452301, bswap64(0x0123456789ABCDEF));

  expect_eq((uint16_t)-1, bswap16(-1));
  expect_eq((uint32_t)0x00FFFFFF, bswap24(-1));
  expect_eq((int32_t)-1, bswap24s(-1));
  expect_eq((uint32_t)-1, bswap32(-1));
  expect_eq((uint64_t)-1, bswap64(-1));

  expect_eq((uint16_t)-257, bswap16(-2));
  expect_eq((int32_t)-65537, bswap24s(-2));
  expect_eq((uint32_t)-16777217, bswap32(-2));
  expect_eq((uint64_t)-72057594037927937, bswap64(-2));

  expect_eq(2.6f, bswap32f((uint32_t)0x66662640));
  expect_eq(0x66662640UL, bswap32f(2.6f));
  expect_eq(3.1, bswap64f((uint64_t)0xCDCCCCCCCCCC0840));
  expect_eq(0xCDCCCCCCCCCC0840, bswap64f(3.1));

  {
    re_uint32_t x;
    x = 3;
    expect_eq(3, x);
    expect_eq(0x03000000, x.load_raw());
    uint32_t y = x;
    expect_eq(3, y);
  }
  {
    re_uint64_t x(0x0102030405060708);
    expect_eq(0x0102030405060708, x);
    expect_eq(0x0807060504030201, x.load_raw());
  }
  {
    re_double x(1.0);
    expect_eq(1.0, x);
    expect_eq(0x000000000000F03F, x.load_raw());
  }

  {
    union {
      uint8_t bytes[4];
      le_uint32_t le32;
      be_uint32_t be32;
    } data;

    data.le32 = 0x01020304;
    expect_eq(data.be32, 0x04030201);
    expect_eq(data.bytes[0], 0x04);
    data.be32 = 0x01020304;
    expect_eq(data.le32, 0x04030201);
    expect_eq(data.bytes[0], 0x01);
  }

  // TODO: test custom alphabets
  expect_eq("", base64_encode("", 0));
  expect_eq("MQ==", base64_encode("1", 1));
  expect_eq("MTE=", base64_encode("11", 2));
  expect_eq("MTEx", base64_encode("111", 3));
  expect_eq("MTExMg==", base64_encode("1112", 4));
  expect_eq("MTExMjI=", base64_encode("11122", 5));
  expect_eq("MTExMjIy", base64_encode("111222", 6));

  expect_eq("", base64_decode("", 0));
  expect_eq("1", base64_decode("MQ==", 4));
  expect_eq("11", base64_decode("MTE=", 4));
  expect_eq("111", base64_decode("MTEx", 4));
  expect_eq("1112", base64_decode("MTExMg==", 8));
  expect_eq("11122", base64_decode("MTExMjI=", 8));
  expect_eq("111222", base64_decode("MTExMjIy", 8));

  expect_eq("The brick quown jox fumps over the dazy log", rot13("Gur oevpx dhbja wbk shzcf bire gur qnml ybt", 43));

  printf("EncodingTest: all tests passed\n");
  return 0;
}